

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Context *context;
  string *psVar1;
  ImmutableFieldGenerator *pIVar2;
  Descriptor *pDVar3;
  OneofGeneratorInfo *pOVar4;
  ClassNameResolver *this_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  long lVar6;
  char *pcVar7;
  long lVar8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  char *pcVar5;
  
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"OrBuilder","");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar3,true,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  if (*(int *)(pDVar3 + 0x68) < 1) {
    pcVar7 = "";
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) != '\0') {
      pcVar7 = "@java.lang.Deprecated ";
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar5 = pcVar7 + 0x16;
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) == '\0') {
      pcVar5 = pcVar7;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar7,pcVar5);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_70,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
    psVar1 = *(string **)(this->super_MessageGenerator).descriptor_;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    io::Printer::Print(printer,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
                       ,"deprecation",&local_b0,"extra_interfaces",&local_70,"classname",psVar1,
                       "idend",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0026dc88;
  }
  else {
    pcVar7 = "";
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) != '\0') {
      pcVar7 = "@java.lang.Deprecated ";
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar5 = pcVar7 + 0x16;
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) == '\0') {
      pcVar5 = pcVar7;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar7,pcVar5);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_70,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    psVar1 = *(string **)(this->super_MessageGenerator).descriptor_;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_50._M_string_length = 2;
    local_50.field_2._M_local_buf[2] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    io::Printer::Print(printer,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage$ver$.\n        ExtendableMessageOrBuilder<$classname$> {\n"
                       ,"deprecation",&local_b0,"extra_interfaces",&local_70,"classname",psVar1,
                       "idend",&local_90,"ver",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT53(local_50.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_50.field_2._M_local_buf[2],
                                        local_50.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0026dc88;
  }
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
LAB_0026dc88:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,"classname","idend",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar8 = 0;
    lVar6 = 0;
    do {
      io::Printer::Print(printer,"\n");
      pIVar2 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)
                          (*(long *)((this->super_MessageGenerator).descriptor_ + 0x30) + lVar8));
      (*pIVar2->_vptr_ImmutableFieldGenerator[4])(pIVar2,printer);
      lVar6 = lVar6 + 1;
      pDVar3 = (this->super_MessageGenerator).descriptor_;
      lVar8 = lVar8 + 0xa8;
    } while (lVar6 < *(int *)(pDVar3 + 0x2c));
  }
  if (0 < *(int *)(pDVar3 + 0x38)) {
    lVar8 = 0;
    lVar6 = 0;
    do {
      pOVar4 = Context::GetOneofGeneratorInfo
                         (this->context_,(OneofDescriptor *)(*(long *)(pDVar3 + 0x40) + lVar8));
      this_00 = Context::GetNameResolver(this->context_);
      ClassNameResolver::GetClassName_abi_cxx11_
                (&local_b0,this_00,(this->super_MessageGenerator).descriptor_,true);
      io::Printer::Print(printer,
                         "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
                         ,"oneof_capitalized_name",&pOVar4->capitalized_name,"classname",&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      pDVar3 = (this->super_MessageGenerator).descriptor_;
      lVar8 = lVar8 + 0x30;
    } while (lVar6 < *(int *)(pDVar3 + 0x38));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage$ver$.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "", "ver", GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "");
  }
  printer->Annotate("classname", "idend", descriptor_);

  printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      printer->Print("\n");
      field_generators_.get(descriptor_->field(i))
                       .GenerateInterfaceMembers(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      printer->Print(
          "\n"
          "public $classname$.$oneof_capitalized_name$Case "
          "get$oneof_capitalized_name$Case();\n",
          "oneof_capitalized_name",
          context_->GetOneofGeneratorInfo(
              descriptor_->oneof_decl(i))->capitalized_name,
          "classname",
          context_->GetNameResolver()->GetImmutableClassName(
              descriptor_));
    }
  printer->Outdent();

  printer->Print("}\n");
}